

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O0

void CB_EXPLORE::predict_or_learn_bag<false>(cb_explore *data,single_learner *base,example *ec)

{
  uint32_t uVar1;
  action_score *paVar2;
  long in_RDX;
  long in_RDI;
  float fVar3;
  float fVar4;
  uint32_t chosen;
  uint32_t count;
  size_t i_1;
  float prob;
  uint32_t i;
  action_scores probs;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  float fVar5;
  uint in_stack_ffffffffffffffa8;
  learner<char,_example> *this;
  uint local_3c;
  v_array<ACTION_SCORE::action_score> local_38;
  long local_18;
  long local_8;
  
  local_38._begin = *(action_score **)(in_RDX + 0x6850);
  local_38._end = *(action_score **)(in_RDX + 0x6858);
  local_38.end_array = *(action_score **)(in_RDX + 0x6860);
  local_38.erase_count = *(size_t *)(in_RDX + 0x6868);
  local_18 = in_RDX;
  local_8 = in_RDI;
  v_array<ACTION_SCORE::action_score>::clear
            ((v_array<ACTION_SCORE::action_score> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  for (local_3c = 0; local_3c < *(uint *)(local_8 + 0x10); local_3c = local_3c + 1) {
    v_array<ACTION_SCORE::action_score>::push_back
              ((v_array<ACTION_SCORE::action_score> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (action_score *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  fVar4 = (float)(long)*(ulong *)(local_8 + 0x118);
  fVar5 = (float)*(ulong *)(local_8 + 0x118);
  fVar3 = 1.0 / fVar5;
  for (this = (learner<char,_example> *)0x0; this < *(learner<char,_example> **)(local_8 + 0x118);
      this = this + 1) {
    uVar1 = BS::weight_gen((vw *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    LEARNER::learner<char,_example>::predict
              (this,(example *)CONCAT44(uVar1,in_stack_ffffffffffffffa8),CONCAT44(fVar5,fVar4));
    in_stack_ffffffffffffffa8 = *(int *)(local_18 + 0x6850) - 1;
    in_stack_ffffffffffffff9c = fVar3;
    paVar2 = v_array<ACTION_SCORE::action_score>::operator[]
                       (&local_38,(ulong)in_stack_ffffffffffffffa8);
    paVar2->score = in_stack_ffffffffffffff9c + paVar2->score;
  }
  *(action_score **)(local_18 + 0x6850) = local_38._begin;
  *(action_score **)(local_18 + 0x6858) = local_38._end;
  *(action_score **)(local_18 + 0x6860) = local_38.end_array;
  *(size_t *)(local_18 + 0x6868) = local_38.erase_count;
  return;
}

Assistant:

void predict_or_learn_bag(cb_explore& data, single_learner& base, example& ec)
{
  // Randomize over predictions from a base set of predictors
  action_scores probs = ec.pred.a_s;
  probs.clear();

  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});
  float prob = 1.f / (float)data.bag_size;
  for (size_t i = 0; i < data.bag_size; i++)
  {
    uint32_t count = BS::weight_gen(*data.all);
    if (is_learn && count > 0)
      base.learn(ec, i);
    else
      base.predict(ec, i);
    uint32_t chosen = ec.pred.multiclass - 1;
    probs[chosen].score += prob;
    if (is_learn)
      for (uint32_t j = 1; j < count; j++) base.learn(ec, i);
  }

  ec.pred.a_s = probs;
}